

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O0

void gguf_set_tensor_type(gguf_context *ctx,char *name,ggml_type type)

{
  uint64_t uVar1;
  long lVar2;
  long lVar3;
  size_type __n;
  reference pvVar4;
  size_t sVar5;
  int64_t iVar6;
  ggml_tensor *tensor_00;
  ggml_type in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  int64_t i_1;
  int64_t n_tensors;
  int i;
  int64_t blck_size;
  size_t type_size;
  ggml_tensor *tensor;
  int64_t tensor_id;
  size_type local_50;
  char *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar7;
  
  __n = gguf_find_tensor((gguf_context *)
                         CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                         in_stack_ffffffffffffffb8);
  if ((long)__n < 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/gguf.cpp"
               ,0x456,"tensor not found: %s",in_RSI);
  }
  pvVar4 = std::vector<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>::operator[]
                     ((vector<gguf_tensor_info,_std::allocator<gguf_tensor_info>_> *)(in_RDI + 0x20)
                      ,__n);
  sVar5 = ggml_type_size(in_EDX);
  iVar6 = ggml_blck_size(in_EDX);
  (pvVar4->t).type = in_EDX;
  if ((pvVar4->t).ne[0] % iVar6 != 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/gguf.cpp"
               ,0x45d,"GGML_ASSERT(%s) failed",
               "tensor->ne[0] % blck_size == 0 && \"tensor row size not divisible by block size of new type\""
              );
  }
  (pvVar4->t).nb[0] = sVar5;
  (pvVar4->t).nb[1] = (pvVar4->t).nb[0] * ((pvVar4->t).ne[0] / iVar6);
  for (iVar7 = 2; iVar7 < 4; iVar7 = iVar7 + 1) {
    (pvVar4->t).nb[iVar7] = (pvVar4->t).nb[iVar7 + -1] * (pvVar4->t).ne[iVar7 + -1];
  }
  tensor_00 = (ggml_tensor *)gguf_get_n_tensors((gguf_context *)0x191df5);
  while (local_50 = __n + 1, (long)local_50 < (long)tensor_00) {
    pvVar4 = std::vector<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>::operator[]
                       ((vector<gguf_tensor_info,_std::allocator<gguf_tensor_info>_> *)
                        (in_RDI + 0x20),__n);
    uVar1 = pvVar4->offset;
    std::vector<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>::operator[]
              ((vector<gguf_tensor_info,_std::allocator<gguf_tensor_info>_> *)(in_RDI + 0x20),__n);
    sVar5 = ggml_nbytes(tensor_00);
    lVar2 = *(long *)(in_RDI + 0x38);
    lVar3 = *(long *)(in_RDI + 0x38);
    pvVar4 = std::vector<gguf_tensor_info,_std::allocator<gguf_tensor_info>_>::operator[]
                       ((vector<gguf_tensor_info,_std::allocator<gguf_tensor_info>_> *)
                        (in_RDI + 0x20),local_50);
    pvVar4->offset = uVar1 + ((sVar5 + lVar2) - 1 & (lVar3 - 1U ^ 0xffffffffffffffff));
    __n = local_50;
  }
  return;
}

Assistant:

void gguf_set_tensor_type(struct gguf_context * ctx, const char * name, enum ggml_type type) {
    const int64_t tensor_id = gguf_find_tensor(ctx, name);
    if (tensor_id < 0) {
        GGML_ABORT("tensor not found: %s", name);
    }
    struct ggml_tensor * tensor = &ctx->info[tensor_id].t;
    const size_t  type_size = ggml_type_size(type);
    const int64_t blck_size = ggml_blck_size(type);

    tensor->type = type;
    GGML_ASSERT(tensor->ne[0] % blck_size == 0 && "tensor row size not divisible by block size of new type");

    tensor->nb[0] = type_size;
    tensor->nb[1] = tensor->nb[0]*(tensor->ne[0]/blck_size);
    for (int i = 2; i < GGML_MAX_DIMS; i++) {
        tensor->nb[i] = tensor->nb[i - 1]*tensor->ne[i - 1];
    }

    // update offsets
    const int64_t n_tensors = gguf_get_n_tensors(ctx);
    for (int64_t i = tensor_id + 1; i < n_tensors; ++i) {
        ctx->info[i].offset = ctx->info[i - 1].offset + GGML_PAD(ggml_nbytes(&ctx->info[i - 1].t), ctx->alignment);
    }
}